

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_curve.cpp
# Opt level: O0

ON_NurbsCurve * __thiscall
ON_Curve::NurbsCurve
          (ON_Curve *this,ON_NurbsCurve *pNurbsCurve,double tolerance,ON_Interval *subdomain)

{
  int iVar1;
  ON_NurbsCurve *pOStack_30;
  int rc;
  ON_NurbsCurve *nurbs_curve;
  ON_Interval *subdomain_local;
  double tolerance_local;
  ON_NurbsCurve *pNurbsCurve_local;
  ON_Curve *this_local;
  
  pOStack_30 = pNurbsCurve;
  if (pNurbsCurve == (ON_NurbsCurve *)0x0) {
    pOStack_30 = (ON_NurbsCurve *)operator_new(0x40);
    ON_NurbsCurve::ON_NurbsCurve(pOStack_30);
  }
  iVar1 = (*(this->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x3f])
                    (tolerance,this,pOStack_30,subdomain);
  if (iVar1 == 0) {
    if ((pNurbsCurve == (ON_NurbsCurve *)0x0) && (pOStack_30 != (ON_NurbsCurve *)0x0)) {
      (*(pOStack_30->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[4])();
    }
    pOStack_30 = (ON_NurbsCurve *)0x0;
  }
  return pOStack_30;
}

Assistant:

ON_NurbsCurve* ON_Curve::NurbsCurve(
      ON_NurbsCurve* pNurbsCurve,
      double tolerance,
      const ON_Interval* subdomain
      ) const
{
  ON_NurbsCurve* nurbs_curve = pNurbsCurve;
  if ( !nurbs_curve )
    nurbs_curve = new ON_NurbsCurve();
  int rc = GetNurbForm( *nurbs_curve, tolerance, subdomain );
  if ( !rc )
  {
    if (!pNurbsCurve)
      delete nurbs_curve;
    nurbs_curve = nullptr;
  }
  return nurbs_curve;
}